

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat3x4.c
# Opt level: O0

void glmc_mat3x4_mul(vec4 *m1,vec3 *m2,vec4 *dest)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  vec4 *dest_local;
  vec3 *m2_local;
  vec4 *m1_local;
  float b32;
  float b31;
  float b30;
  float b22;
  float b21;
  float b20;
  float b12;
  float b11;
  float b10;
  float b02;
  float b01;
  float b00;
  float a23;
  float a22;
  float a21;
  float a20;
  float a13;
  float a12;
  float a11;
  float a10;
  float a03;
  float a02;
  float a01;
  float a00;
  
  fVar1 = (*m1)[0];
  fVar2 = (*m1)[1];
  fVar3 = (*m1)[2];
  fVar4 = (*m1)[3];
  fVar5 = m1[1][0];
  fVar6 = m1[1][1];
  fVar7 = m1[1][2];
  fVar8 = m1[1][3];
  fVar9 = m1[2][0];
  fVar10 = m1[2][1];
  fVar11 = m1[2][2];
  fVar12 = m1[2][3];
  fVar13 = (*m2)[0];
  fVar14 = (*m2)[1];
  fVar15 = (*m2)[2];
  fVar16 = m2[1][0];
  fVar17 = m2[1][1];
  fVar18 = m2[1][2];
  fVar19 = m2[2][0];
  fVar20 = m2[2][1];
  fVar21 = m2[2][2];
  fVar22 = m2[3][0];
  fVar23 = m2[3][1];
  fVar24 = m2[3][2];
  (*dest)[0] = fVar9 * fVar15 + fVar1 * fVar13 + fVar5 * fVar14;
  (*dest)[1] = fVar10 * fVar15 + fVar2 * fVar13 + fVar6 * fVar14;
  (*dest)[2] = fVar11 * fVar15 + fVar3 * fVar13 + fVar7 * fVar14;
  (*dest)[3] = fVar12 * fVar15 + fVar4 * fVar13 + fVar8 * fVar14;
  dest[1][0] = fVar9 * fVar18 + fVar1 * fVar16 + fVar5 * fVar17;
  dest[1][1] = fVar10 * fVar18 + fVar2 * fVar16 + fVar6 * fVar17;
  dest[1][2] = fVar11 * fVar18 + fVar3 * fVar16 + fVar7 * fVar17;
  dest[1][3] = fVar12 * fVar18 + fVar4 * fVar16 + fVar8 * fVar17;
  dest[2][0] = fVar9 * fVar21 + fVar1 * fVar19 + fVar5 * fVar20;
  dest[2][1] = fVar10 * fVar21 + fVar2 * fVar19 + fVar6 * fVar20;
  dest[2][2] = fVar11 * fVar21 + fVar3 * fVar19 + fVar7 * fVar20;
  dest[2][3] = fVar12 * fVar21 + fVar4 * fVar19 + fVar8 * fVar20;
  dest[3][0] = fVar9 * fVar24 + fVar1 * fVar22 + fVar5 * fVar23;
  dest[3][1] = fVar10 * fVar24 + fVar2 * fVar22 + fVar6 * fVar23;
  dest[3][2] = fVar11 * fVar24 + fVar3 * fVar22 + fVar7 * fVar23;
  dest[3][3] = fVar12 * fVar24 + fVar4 * fVar22 + fVar8 * fVar23;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_mat3x4_mul(mat3x4 m1, mat4x3 m2, mat4 dest) {
  glm_mat3x4_mul(m1, m2, dest);
}